

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::flip(Solver *this,int lit)

{
  bool bVar1;
  State *pSVar2;
  uint in_ESI;
  External *in_RDI;
  Solver *unaff_retaddr;
  bool res;
  undefined4 in_stack_fffffffffffffff0;
  External *this_00;
  
  this_00 = in_RDI;
  if ((*(Internal **)&in_RDI->max_var != (Internal *)0x0) &&
     (*(FILE **)&(in_RDI->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset != (FILE *)0x0
     )) {
    trace_api_call(unaff_retaddr,(char *)in_RDI,in_ESI);
  }
  require_solver_pointer_to_be_non_zero
            ((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)in_RDI,(char *)0xe24575);
  if ((External *)in_RDI->vsize == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (*(Internal **)&in_RDI->max_var == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state((Solver *)in_RDI);
  if ((*pSVar2 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if ((in_ESI == 0) || (in_ESI == 0x80000000)) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"invalid literal \'%d\'",(ulong)in_ESI);
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state((Solver *)in_RDI);
  if (*pSVar2 != SATISFIED) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"can only flip value in satisfied state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (((External *)in_RDI->vsize)->propagator != (ExternalPropagator *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","bool CaDiCaL::Solver::flip(int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"can only flip when no external propagator is present");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  bVar1 = External::flip(this_00,in_ESI);
  return bVar1;
}

Assistant:

bool Solver::flip (int lit) {
  TRACE ("flip", lit);
  REQUIRE_VALID_STATE ();
  REQUIRE_VALID_LIT (lit);
  REQUIRE (state () == SATISFIED, "can only flip value in satisfied state");
  REQUIRE (!external->propagator,
           "can only flip when no external propagator is present");
  bool res = external->flip (lit);
  LOG_API_CALL_RETURNS ("flip", lit, res);
  assert (state () == SATISFIED);
  return res;
}